

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

RefEq * __thiscall wasm::Builder::makeRefEq(Builder *this,Expression *left,Expression *right)

{
  RefEq *pRVar1;
  RefEq *ret;
  Expression *right_local;
  Expression *left_local;
  Builder *this_local;
  
  pRVar1 = MixedArena::alloc<wasm::RefEq>(&this->wasm->allocator);
  pRVar1->left = left;
  pRVar1->right = right;
  wasm::RefEq::finalize();
  return pRVar1;
}

Assistant:

RefEq* makeRefEq(Expression* left, Expression* right) {
    auto* ret = wasm.allocator.alloc<RefEq>();
    ret->left = left;
    ret->right = right;
    ret->finalize();
    return ret;
  }